

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_classtrait.cpp
# Opt level: O3

void __thiscall
pfederc::Parser::parseClassTraitBody
          (Parser *this,bool *err,
          list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
          *functions)

{
  size_t *psVar1;
  size_t sVar2;
  Token *pTVar3;
  size_t sVar4;
  Lexer *pLVar5;
  bool bVar6;
  _List_node_base *p_Var7;
  pointer __p;
  Lexer *pLVar8;
  unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_> funcExpr;
  _Head_base<0UL,_pfederc::FuncExpr_*,_false> local_60;
  Lexer *local_58;
  Error<pfederc::SyntaxErrorCode> *local_50;
  undefined1 local_48 [16];
  
  bVar6 = Token::operator!=(this->lexer->currentToken,TOK_STMT);
  if (bVar6) {
    do {
      bVar6 = Token::operator!=(this->lexer->currentToken,TOK_EOF);
      if (!bVar6) {
        return;
      }
      bVar6 = Token::operator==(this->lexer->currentToken,TOK_EOL);
      if (bVar6) {
        Lexer::next(this->lexer);
      }
      else {
        parseExpression((Parser *)&local_58,(Precedence)this);
        pLVar8 = local_58;
        if (local_58 != (Lexer *)0x0) {
          if (*(int *)&(local_58->filePath)._M_dataplus._M_p == 4) {
            local_58 = (Lexer *)0x0;
            if ((_List_node_base *)pLVar8->_vptr_Lexer != (_List_node_base *)&PTR__FuncExpr_00127788
               ) {
              pLVar8 = (Lexer *)0x0;
            }
            local_60._M_head_impl = (FuncExpr *)pLVar8;
            if ((pLVar8->lineIndices).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
              local_50 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
              sVar2 = *(size_t *)((long)&(pLVar8->filePath).field_2 + 8);
              local_50->logLevel = LVL_ERROR;
              local_50->err = STX_ERR_TRAITCLASS_SCOPE_FUNC_BODY;
              sVar4 = (pLVar8->filePath).field_2._M_allocated_capacity;
              (local_50->pos).line = (pLVar8->filePath)._M_string_length;
              (local_50->pos).startIndex = sVar4;
              (local_50->pos).endIndex = sVar2;
              (local_50->extraPos).
              super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              (local_50->extraPos).
              super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              (local_50->extraPos).
              super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              generateError((Parser *)&stack0xffffffffffffffc8,
                            (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                             *)this);
              std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::
              ~unique_ptr((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>
                           *)&stack0xffffffffffffffc8);
              if (local_50 != (Error<pfederc::SyntaxErrorCode> *)0x0) {
                std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                          ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_50,
                           local_50);
              }
            }
            p_Var7 = (_List_node_base *)operator_new(0x18);
            p_Var7[1]._M_next = (_List_node_base *)local_60._M_head_impl;
            local_60._M_head_impl = (FuncExpr *)0x0;
            std::__detail::_List_node_base::_M_hook(p_Var7);
            psVar1 = &(functions->
                      super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                      )._M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
            std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>::~unique_ptr
                      ((unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_> *)
                       &local_60);
          }
          else {
            local_60._M_head_impl = (FuncExpr *)operator_new(0x38);
            sVar2 = *(size_t *)((long)&(pLVar8->filePath).field_2 + 8);
            *(Level *)&((local_60._M_head_impl)->super_Expr)._vptr_Expr = LVL_ERROR;
            *(SyntaxErrorCode *)((long)&((local_60._M_head_impl)->super_Expr)._vptr_Expr + 4) =
                 STX_ERR_TRAIT_SCOPE;
            pLVar5 = (Lexer *)(pLVar8->filePath).field_2._M_allocated_capacity;
            ((Position *)&((local_60._M_head_impl)->super_Expr).parent)->line =
                 (pLVar8->filePath)._M_string_length;
            ((local_60._M_head_impl)->super_Expr).lexer = pLVar5;
            *(size_t *)&((local_60._M_head_impl)->super_Expr).type = sVar2;
            (((_Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_> *)
             &((local_60._M_head_impl)->super_Expr).pos.line)->_M_impl).super__Vector_impl_data.
            _M_start = (pointer)0x0;
            ((local_60._M_head_impl)->super_Expr).pos.startIndex = 0;
            ((local_60._M_head_impl)->super_Expr).pos.endIndex = 0;
            generateError((Parser *)(local_48 + 8),
                          (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                           *)this);
            std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::
            ~unique_ptr((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                        (local_48 + 8));
            if (local_60._M_head_impl != (FuncExpr *)0x0) {
              std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                        ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_60,
                         (Error<pfederc::SyntaxErrorCode> *)local_60._M_head_impl);
            }
          }
        }
        bVar6 = expect(this,TOK_EOL);
        if (!bVar6) {
          pTVar3 = this->lexer->currentToken;
          local_60._M_head_impl = (FuncExpr *)operator_new(0x38);
          sVar2 = (pTVar3->pos).endIndex;
          *(Level *)&((local_60._M_head_impl)->super_Expr)._vptr_Expr = LVL_ERROR;
          *(SyntaxErrorCode *)((long)&((local_60._M_head_impl)->super_Expr)._vptr_Expr + 4) =
               STX_ERR_EXPECTED_EOL;
          pLVar8 = (Lexer *)(pTVar3->pos).startIndex;
          ((Position *)&((local_60._M_head_impl)->super_Expr).parent)->line = (pTVar3->pos).line;
          ((local_60._M_head_impl)->super_Expr).lexer = pLVar8;
          *(size_t *)&((local_60._M_head_impl)->super_Expr).type = sVar2;
          (((_Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_> *)
           &((local_60._M_head_impl)->super_Expr).pos.line)->_M_impl).super__Vector_impl_data.
          _M_start = (pointer)0x0;
          ((local_60._M_head_impl)->super_Expr).pos.startIndex = 0;
          ((local_60._M_head_impl)->super_Expr).pos.endIndex = 0;
          generateError((Parser *)local_48,
                        (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)this);
          std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                    ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                     local_48);
          if (local_60._M_head_impl != (FuncExpr *)0x0) {
            std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                      ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_60,
                       (Error<pfederc::SyntaxErrorCode> *)local_60._M_head_impl);
          }
          skipToStmtEol(this);
        }
        if (local_58 != (Lexer *)0x0) {
          (*(code *)((_List_node_base *)local_58->_vptr_Lexer)->_M_prev)();
        }
      }
      bVar6 = Token::operator!=(this->lexer->currentToken,TOK_STMT);
    } while (bVar6);
  }
  return;
}

Assistant:

void Parser::parseClassTraitBody(bool &err,
    std::list<std::unique_ptr<FuncExpr>> &functions) noexcept {
  while (*lexer.getCurrentToken() != TokenType::TOK_STMT
      && *lexer.getCurrentToken() != TokenType::TOK_EOF) {
    if (*lexer.getCurrentToken() == TokenType::TOK_EOL) {
      lexer.next();
      continue;
    }

    std::unique_ptr<Expr> expr(parseExpression());
    if (expr && expr->getType() == ExprType::EXPR_FUNC) {
      std::unique_ptr<FuncExpr> funcExpr(
            dynamic_cast<FuncExpr*>(expr.release()));

      /*if (funcExpr->getTemplates()) {
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
              SyntaxErrorCode::STX_ERR_TRAIT_SCOPE_FUNC_TEMPL,
              std::get<0>(funcExpr->getTemplates()->front())->getPosition()
              + std::get<1>(funcExpr->getTemplates()->back())->getPosition()));
      }*/

      if (!funcExpr->getBody()) {
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
              SyntaxErrorCode::STX_ERR_TRAITCLASS_SCOPE_FUNC_BODY,
              funcExpr->getPosition()));
      }

      functions.push_back(std::move(funcExpr));
    } else if (expr) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR, 
            SyntaxErrorCode::STX_ERR_TRAIT_SCOPE, expr->getPosition()));
      // soft error
    }

    if (!expect(TokenType::TOK_EOL)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
      // soft error
      skipToStmtEol();
    }
  }
}